

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_InterpBndryData.cpp
# Opt level: O0

void __thiscall
amrex::InterpBndryData::setBndryValues
          (InterpBndryData *this,MultiFab *mf,int mf_start,int bnd_start,int num_comp,
          IntVect *ref_ratio,BCRec *bc)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  uint in_ECX;
  int in_EDX;
  MFItInfo *in_RSI;
  FabArrayBase *in_RDI;
  int in_R8D;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  int i;
  int j;
  int k;
  int n_1;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Box *b;
  Array4<const_double> src_array;
  Array4<double> bnd_array;
  FArrayBox *src_fab;
  FArrayBox *bnd_fab;
  Orientation face;
  OrientationIter fi;
  Box *bx;
  MFIter mfi;
  int n;
  MFIter *in_stack_fffffffffffffb18;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffb20;
  Geometry *in_stack_fffffffffffffb30;
  Orientation in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb50;
  int iVar5;
  undefined4 in_stack_fffffffffffffb54;
  int local_4a8;
  int local_4a4;
  int local_464;
  int local_460;
  int iStack_45c;
  int iStack_458;
  int local_454;
  int iStack_450;
  int *local_448;
  Array4<const_double> local_440;
  Array4<double> local_400;
  BaseFab<double> *local_3c0;
  BaseFab<double> *local_3b8;
  int local_3ac;
  int local_3a8;
  Orientation local_3a4;
  OrientationIter local_3a0;
  undefined1 local_39c [28];
  undefined1 *local_380;
  MFItInfo local_374;
  MFIter local_360;
  uint local_2fc;
  undefined8 local_2f8;
  int local_2ec;
  uint local_2e8;
  int local_2e4;
  MFItInfo *local_2e0;
  BaseFab<double> *local_2d0;
  BaseFab<double> *local_2c8;
  int *local_2b0;
  int *local_288;
  int local_270;
  int local_26c;
  int local_268;
  int local_264;
  Array4<const_double> *local_260;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  Array4<double> *local_248;
  undefined4 local_23c;
  int *local_238;
  undefined4 local_22c;
  int *local_228;
  undefined4 local_21c;
  int *local_218;
  undefined4 local_20c;
  int *local_208;
  undefined4 local_1fc;
  int *local_1f8;
  undefined4 local_1ec;
  int *local_1e8;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  Box *local_1a0;
  double *local_198;
  Dim3 local_190;
  Box *local_180;
  int local_178;
  int iStack_174;
  int local_170;
  undefined4 local_16c;
  Box *local_168;
  undefined4 local_15c;
  Box *local_158;
  undefined4 local_14c;
  Box *local_148;
  Dim3 local_140;
  Box *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  undefined4 local_fc;
  IntVect *local_f8;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  double *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_2f8 = in_R9;
  local_2ec = in_R8D;
  local_2e8 = in_ECX;
  local_2e4 = in_EDX;
  local_2e0 = in_RSI;
  for (local_2fc = in_ECX; (int)local_2fc < (int)(local_2e8 + local_2ec); local_2fc = local_2fc + 1)
  {
    (*in_RDI->_vptr_FabArrayBase[3])(in_RDI,in_stack_00000008,local_2f8,(ulong)local_2fc);
  }
  MFItInfo::MFItInfo((MFItInfo *)in_stack_fffffffffffffb30);
  MFItInfo::SetDynamic(&local_374,true);
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),in_RDI,
                 local_2e0);
  while (bVar1 = MFIter::isValid(&local_360), bVar1) {
    MFIter::validbox((MFIter *)in_stack_fffffffffffffb30);
    local_380 = local_39c;
    OrientationIter::OrientationIter(&local_3a0);
    while (pvVar4 = OrientationIter::operator_cast_to_void_(&local_3a0), pvVar4 != (void *)0x0) {
      local_3a8 = (int)OrientationIter::operator()((OrientationIter *)in_stack_fffffffffffffb18);
      local_3a4 = (Orientation)local_3a8;
      iVar2 = Box::operator[]((Box *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb38);
      Geometry::Domain((Geometry *)
                       &in_RDI[0xc].boxarray.m_simplified_list.
                        super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      local_3ac = local_3a4.val;
      iVar3 = Box::operator[]((Box *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb38);
      if (iVar2 == iVar3) {
        in_stack_fffffffffffffb30 =
             (Geometry *)
             &in_RDI[0xc].boxarray.m_simplified_list.
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        iVar2 = Orientation::coordDir(&local_3a4);
        bVar1 = Geometry::isPeriodic(in_stack_fffffffffffffb30,iVar2);
        if (!bVar1) {
          Orientation::operator_cast_to_int(&local_3a4);
          in_stack_fffffffffffffb18 = &local_360;
          local_3b8 = &FabSet::operator[]((FabSet *)in_stack_fffffffffffffb20,
                                          in_stack_fffffffffffffb18)->super_BaseFab<double>;
          local_3c0 = &FabArray<amrex::FArrayBox>::operator[]
                                 (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18)->
                       super_BaseFab<double>;
          local_2d0 = local_3b8;
          local_198 = local_3b8->dptr;
          local_1a0 = &local_3b8->domain;
          local_1a4 = local_3b8->nvar;
          local_14c = 0;
          local_178 = (local_1a0->smallend).vect[0];
          local_15c = 1;
          iStack_174 = (local_3b8->domain).smallend.vect[1];
          local_1c0.x = (local_1a0->smallend).vect[0];
          local_1c0.y = (local_1a0->smallend).vect[1];
          local_16c = 2;
          local_1c0.z = (local_3b8->domain).smallend.vect[2];
          local_f8 = &(local_3b8->domain).bigend;
          local_fc = 0;
          local_128 = local_f8->vect[0] + 1;
          local_108 = &(local_3b8->domain).bigend;
          local_10c = 1;
          iStack_124 = (local_3b8->domain).bigend.vect[1] + 1;
          local_118 = &(local_3b8->domain).bigend;
          local_11c = 2;
          local_1e0.z = (local_3b8->domain).bigend.vect[2] + 1;
          local_1e0.y = iStack_124;
          local_1e0.x = local_128;
          local_1d0._0_8_ = local_1e0._0_8_;
          local_1d0.z = local_1e0.z;
          local_1b0._0_8_ = local_1c0._0_8_;
          local_1b0.z = local_1c0.z;
          local_190._0_8_ = local_1c0._0_8_;
          local_190.z = local_1c0.z;
          local_180 = local_1a0;
          local_170 = local_1c0.z;
          local_168 = local_1a0;
          local_158 = local_1a0;
          local_148 = local_1a0;
          local_140._0_8_ = local_1e0._0_8_;
          local_140.z = local_1e0.z;
          local_130 = local_1a0;
          local_120 = local_1e0.z;
          Array4<double>::Array4(&local_400,local_198,&local_1b0,&local_1d0,local_1a4);
          local_2c8 = local_3c0;
          local_a8 = local_3c0->dptr;
          local_b0 = &local_3c0->domain;
          local_b4 = local_3c0->nvar;
          local_5c = 0;
          local_88 = (local_b0->smallend).vect[0];
          local_6c = 1;
          iStack_84 = (local_3c0->domain).smallend.vect[1];
          local_d0.x = (local_b0->smallend).vect[0];
          local_d0.y = (local_b0->smallend).vect[1];
          local_7c = 2;
          local_d0.z = (local_3c0->domain).smallend.vect[2];
          local_8 = &(local_3c0->domain).bigend;
          local_c = 0;
          local_38 = local_8->vect[0] + 1;
          local_18 = &(local_3c0->domain).bigend;
          local_1c = 1;
          iStack_34 = (local_3c0->domain).bigend.vect[1] + 1;
          local_28 = &(local_3c0->domain).bigend;
          local_2c = 2;
          local_f0.z = (local_3c0->domain).bigend.vect[2] + 1;
          local_f0.y = iStack_34;
          local_f0.x = local_38;
          local_e0._0_8_ = local_f0._0_8_;
          local_e0.z = local_f0.z;
          local_c0._0_8_ = local_d0._0_8_;
          local_c0.z = local_d0.z;
          local_a0._0_8_ = local_d0._0_8_;
          local_a0.z = local_d0.z;
          local_90 = local_b0;
          local_80 = local_d0.z;
          local_78 = local_b0;
          local_68 = local_b0;
          local_58 = local_b0;
          local_50._0_8_ = local_f0._0_8_;
          local_50.z = local_f0.z;
          local_40 = local_b0;
          local_30 = local_f0.z;
          Array4<const_double>::Array4(&local_440,local_a8,&local_c0,&local_e0,local_b4);
          in_stack_fffffffffffffb20 = (FabArray<amrex::FArrayBox> *)BaseFab<double>::box(local_3c0);
          BaseFab<double>::box(local_3b8);
          Box::operator&((Box *)in_stack_fffffffffffffb20,(Box *)in_stack_fffffffffffffb18);
          local_1ec = 0;
          local_1fc = 1;
          local_20c = 2;
          local_218 = &iStack_458;
          local_21c = 0;
          local_228 = &iStack_458;
          local_22c = 1;
          local_238 = &iStack_458;
          local_23c = 2;
          for (local_4a4 = 0; local_4a8 = iStack_45c, local_448 = &local_464, local_2b0 = &local_464
              , local_288 = &local_464, local_208 = &local_464, local_1f8 = &local_464,
              local_1e8 = &local_464, local_4a4 < local_2ec; local_4a4 = local_4a4 + 1) {
            for (; iVar2 = local_460, local_4a8 <= iStack_450; local_4a8 = local_4a8 + 1) {
              for (; iVar3 = local_464, iVar2 <= local_454; iVar2 = iVar2 + 1) {
                while (iVar5 = iVar3, iVar5 <= iStack_458) {
                  local_26c = local_4a8;
                  local_270 = local_4a4 + local_2e4;
                  local_260 = &local_440;
                  local_254 = local_4a8;
                  local_258 = local_4a4 + local_2e8;
                  local_248 = &local_400;
                  local_400.p
                  [(long)(iVar5 - local_400.begin.x) +
                   (iVar2 - local_400.begin.y) * local_400.jstride +
                   (local_4a8 - local_400.begin.z) * local_400.kstride +
                   local_258 * local_400.nstride] =
                       local_440.p
                       [(long)(iVar5 - local_440.begin.x) +
                        (iVar2 - local_440.begin.y) * local_440.jstride +
                        (local_4a8 - local_440.begin.z) * local_440.kstride +
                        local_270 * local_440.nstride];
                  local_268 = iVar2;
                  local_264 = iVar5;
                  local_250 = iVar2;
                  local_24c = iVar5;
                  iVar3 = iVar5 + 1;
                }
              }
            }
          }
        }
      }
      OrientationIter::operator++(&local_3a0);
    }
    MFIter::operator++(&local_360);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffffb20);
  return;
}

Assistant:

void
InterpBndryData::setBndryValues (const MultiFab& mf,
                                 int             mf_start,
                                 int             bnd_start,
                                 int             num_comp,
                                 const IntVect&  ref_ratio,
                                 const BCRec&    bc)
{
    //
    // Check that boxarrays are identical.
    //
    BL_ASSERT(grids.size());
    BL_ASSERT(grids == mf.boxArray());

    for (int n = bnd_start; n < bnd_start+num_comp; ++n) {
        setBndryConds(bc, ref_ratio, n);
    }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf,MFItInfo().SetDynamic(true)); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.validbox();

        for (OrientationIter fi; fi; ++fi)
        {
            const Orientation face = fi();

            if (bx[face]==geom.Domain()[face] && !geom.isPeriodic(face.coordDir()))
            {
                //
                // Physical bndry, copy from grid.
                //
                auto& bnd_fab = bndry[face][mfi];
                auto const& src_fab = mf[mfi];
                auto bnd_array = bnd_fab.array();
                auto const src_array = src_fab.array();
                const Box& b = src_fab.box() & bnd_fab.box();
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( b, num_comp, i, j, k, n,
                {
                    bnd_array(i,j,k,n+bnd_start) = src_array(i,j,k,n+mf_start);
                });
            }
        }
    }
}